

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeGravityForces
          (ChElementBeamIGA *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  Index IVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  double *pdVar7;
  Index index;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ChVectorDynamic<> mG;
  ChMatrixDynamic<> mM;
  assign_op<double,_double> local_99;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  DenseStorage<double,__1,__1,__1,_1> local_88;
  double *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  uVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])();
  uVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  lVar6 = (long)(int)uVar3;
  lVar8 = (long)(int)uVar2;
  local_88.m_cols = 0;
  local_88.m_data = (double *)0x0;
  local_88.m_rows = 0;
  if ((int)(uVar3 | uVar2) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  if (((uVar2 != 0) && (uVar3 != 0)) &&
     (SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar6),0) < lVar8)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_88,lVar6 * lVar8,lVar8,lVar6);
  local_68 = local_88.m_data;
  local_60 = local_88.m_rows;
  local_58 = local_88.m_cols;
  if ((local_88.m_rows | local_88.m_cols) < 0 && local_88.m_data != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                 );
  }
  local_50 = local_88.m_cols;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[7])
            (this);
  iVar4 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,(long)iVar4);
  IVar1 = local_98.m_storage.m_rows;
  if (local_98.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_98.m_storage.m_rows != 0) {
    memset(local_98.m_storage.m_data,0,local_98.m_storage.m_rows * 8);
  }
  lVar6 = (long)(this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 4;
    lVar8 = 0;
    pdVar7 = local_98.m_storage.m_data;
    do {
      if ((long)(IVar1 - 3U) < lVar8 * 6) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar9 = 3;
      if (((ulong)local_98.m_storage.m_data & 7) == 0) {
        uVar2 = -((uint)((ulong)(local_98.m_storage.m_data + lVar8 * 6) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar2 < 3) {
          uVar9 = (ulong)uVar2;
        }
        if (uVar2 != 0) goto LAB_0068cfbc;
      }
      else {
LAB_0068cfbc:
        uVar10 = 0;
        do {
          pdVar7[uVar10] = G_acc->m_data[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (uVar9 < 3) {
        do {
          pdVar7[uVar9] = G_acc->m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar9 != 3);
      }
      lVar8 = lVar8 + 1;
      pdVar7 = pdVar7 + 6;
    } while (lVar8 != lVar6 + (ulong)(lVar6 == 0));
  }
  if (local_88.m_cols == IVar1) {
    local_40.m_lhs = (LhsNested)&local_88;
    local_40.m_rhs = (RhsNested)&local_98;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
              (Fg,&local_40,&local_99,(type)0x0);
    if (local_98.m_storage.m_data != (double *)0x0) {
      free((void *)local_98.m_storage.m_data[-1]);
    }
    if (local_88.m_data != (double *)0x0) {
      free((void *)local_88.m_data[-1]);
    }
    return;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementBeamIGA::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    // no so efficient... a temporary mass matrix here:
    ChMatrixDynamic<> mM(this->GetNdofs(), this->GetNdofs());
    this->ComputeMmatrixGlobal(mM);

    // a vector of G accelerations (for translation degrees of freedom ie 3 xyz every 6 values)
    ChVectorDynamic<> mG(this->GetNdofs());
    mG.setZero();
    for (int i = 0; i < nodes.size(); ++i) {
        mG.segment(i * 6, 3) = G_acc.eigen();
    }

    // Gravity forces as M*g, always works, regardless of the way M
    // is computed (lumped or consistent, with offset center of mass or centered, etc.)
    // [Maybe one can replace this function with a faster ad-hoc implementation in case of lumped masses.]
    Fg = mM * mG;
}